

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O2

void plutovg_canvas_save(plutovg_canvas_t *canvas)

{
  int *piVar1;
  uint uVar2;
  plutovg_state_t *ppVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  plutovg_line_cap_t pVar8;
  plutovg_line_join_t pVar9;
  plutovg_operator_t pVar10;
  ulong uVar11;
  plutovg_state_t *ppVar12;
  plutovg_paint_t *ppVar13;
  plutovg_font_face_t *ppVar14;
  ulong uVar15;
  float *pfVar16;
  int iVar17;
  long lVar18;
  float *__src;
  
  ppVar12 = canvas->freed_state;
  if (ppVar12 == (plutovg_state_t *)0x0) {
    ppVar12 = plutovg_state_create();
  }
  else {
    canvas->freed_state = ppVar12->next;
  }
  ppVar3 = canvas->state;
  ppVar13 = plutovg_paint_reference(ppVar3->paint);
  ppVar12->paint = ppVar13;
  ppVar14 = plutovg_font_face_reference(ppVar3->font_face);
  ppVar12->font_face = ppVar14;
  fVar5 = (ppVar3->color).g;
  fVar6 = (ppVar3->color).b;
  fVar7 = (ppVar3->color).a;
  (ppVar12->color).r = (ppVar3->color).r;
  (ppVar12->color).g = fVar5;
  (ppVar12->color).b = fVar6;
  (ppVar12->color).a = fVar7;
  fVar5 = (ppVar3->matrix).f;
  (ppVar12->matrix).e = (ppVar3->matrix).e;
  (ppVar12->matrix).f = fVar5;
  fVar5 = (ppVar3->matrix).b;
  fVar6 = (ppVar3->matrix).c;
  fVar7 = (ppVar3->matrix).d;
  (ppVar12->matrix).a = (ppVar3->matrix).a;
  (ppVar12->matrix).b = fVar5;
  (ppVar12->matrix).c = fVar6;
  (ppVar12->matrix).d = fVar7;
  pVar8 = (ppVar3->stroke).style.cap;
  pVar9 = (ppVar3->stroke).style.join;
  fVar5 = (ppVar3->stroke).style.miter_limit;
  (ppVar12->stroke).style.width = (ppVar3->stroke).style.width;
  (ppVar12->stroke).style.cap = pVar8;
  (ppVar12->stroke).style.join = pVar9;
  (ppVar12->stroke).style.miter_limit = fVar5;
  (ppVar12->stroke).dash.offset = (ppVar3->stroke).dash.offset;
  (ppVar12->stroke).dash.array.size = 0;
  __src = (ppVar3->stroke).dash.array.data;
  if ((__src != (float *)0x0) && (iVar17 = (ppVar3->stroke).dash.array.size, 0 < iVar17)) {
    uVar2 = (ppVar12->stroke).dash.array.capacity;
    if ((int)uVar2 < iVar17) {
      uVar11 = 8;
      if (uVar2 != 0) {
        uVar11 = (ulong)uVar2;
      }
      do {
        uVar15 = uVar11;
        iVar4 = (int)uVar15;
        uVar11 = (ulong)(uint)(iVar4 * 2);
      } while (iVar4 < iVar17);
      pfVar16 = (float *)realloc((ppVar12->stroke).dash.array.data,uVar15 << 2);
      (ppVar12->stroke).dash.array.data = pfVar16;
      (ppVar12->stroke).dash.array.capacity = iVar4;
      lVar18 = (long)(ppVar12->stroke).dash.array.size;
      __src = (ppVar3->stroke).dash.array.data;
      iVar17 = (ppVar3->stroke).dash.array.size;
    }
    else {
      pfVar16 = (ppVar12->stroke).dash.array.data;
      lVar18 = 0;
    }
    memcpy(pfVar16 + lVar18,__src,(long)iVar17 << 2);
    piVar1 = &(ppVar12->stroke).dash.array.size;
    *piVar1 = *piVar1 + (ppVar3->stroke).dash.array.size;
  }
  plutovg_span_buffer_copy(&ppVar12->clip_spans,&ppVar3->clip_spans);
  pVar10 = ppVar3->op;
  ppVar12->winding = ppVar3->winding;
  ppVar12->op = pVar10;
  fVar5 = ppVar3->opacity;
  ppVar12->font_size = ppVar3->font_size;
  ppVar12->opacity = fVar5;
  ppVar12->clipping = ppVar3->clipping;
  ppVar12->next = canvas->state;
  canvas->state = ppVar12;
  return;
}

Assistant:

void plutovg_canvas_save(plutovg_canvas_t* canvas)
{
    plutovg_state_t* new_state = canvas->freed_state;
    if(new_state == NULL)
        new_state = plutovg_state_create();
    else
        canvas->freed_state = new_state->next;
    plutovg_state_copy(new_state, canvas->state);
    new_state->next = canvas->state;
    canvas->state = new_state;
}